

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,double,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::EpochOperator>>
               (interval_t *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  idx_t iVar10;
  ulong uVar11;
  int iVar12;
  int64_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar13 = &ldata->micros;
      iVar10 = 0;
      do {
        lVar2._0_4_ = ((interval_t *)(piVar13 + -1))->months;
        lVar2._4_4_ = ((interval_t *)(piVar13 + -1))->days;
        iVar12 = ((int)(undefined4)lVar2 / 6 + ((int)(undefined4)lVar2 >> 0x1f) >> 1) -
                 ((int)(undefined4)lVar2 >> 0x1f);
        result_data[iVar10] =
             (double)*piVar13 / 1000000.0 +
             (double)((lVar2 >> 0x20) * 0x15180 + (long)iVar12 * 0x1e187e0 +
                     (long)(((undefined4)lVar2 + iVar12 * -0xc) * 0x1e) * 0x15180);
        iVar10 = iVar10 + 1;
        piVar13 = piVar13 + 2;
      } while (count != iVar10);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var7 = p_Stack_40;
      peVar6 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar6;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar9->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar14 = 0;
      uVar11 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar15 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar15 = count;
          }
LAB_00ef1c72:
          uVar8 = uVar14;
          if (uVar14 < uVar15) {
            piVar13 = &ldata[uVar14].micros;
            do {
              lVar5._0_4_ = ((interval_t *)(piVar13 + -1))->months;
              lVar5._4_4_ = ((interval_t *)(piVar13 + -1))->days;
              iVar12 = ((int)(undefined4)lVar5 / 6 + ((int)(undefined4)lVar5 >> 0x1f) >> 1) -
                       ((int)(undefined4)lVar5 >> 0x1f);
              result_data[uVar14] =
                   (double)*piVar13 / 1000000.0 +
                   (double)((lVar5 >> 0x20) * 0x15180 + (long)iVar12 * 0x1e187e0 +
                           (long)(((undefined4)lVar5 + iVar12 * -0xc) * 0x1e) * 0x15180);
              uVar14 = uVar14 + 1;
              piVar13 = piVar13 + 2;
              uVar8 = uVar15;
            } while (uVar15 != uVar14);
          }
        }
        else {
          uVar3 = puVar1[uVar11];
          uVar15 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar15 = count;
          }
          uVar8 = uVar15;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_00ef1c72;
            uVar8 = uVar14;
            if (uVar14 < uVar15) {
              piVar13 = &ldata[uVar14].micros;
              uVar16 = 0;
              do {
                if ((uVar3 >> (uVar16 & 0x3f) & 1) != 0) {
                  lVar4._0_4_ = ((interval_t *)(piVar13 + -1))->months;
                  lVar4._4_4_ = ((interval_t *)(piVar13 + -1))->days;
                  iVar12 = ((int)(undefined4)lVar4 / 6 + ((int)(undefined4)lVar4 >> 0x1f) >> 1) -
                           ((int)(undefined4)lVar4 >> 0x1f);
                  result_data[uVar14 + uVar16] =
                       (double)*piVar13 / 1000000.0 +
                       (double)((lVar4 >> 0x20) * 0x15180 + (long)iVar12 * 0x1e187e0 +
                               (long)(((undefined4)lVar4 + iVar12 * -0xc) * 0x1e) * 0x15180);
                }
                uVar16 = uVar16 + 1;
                piVar13 = piVar13 + 2;
                uVar8 = uVar15;
              } while (uVar15 - uVar14 != uVar16);
            }
          }
        }
        uVar14 = uVar8;
        uVar11 = uVar11 + 1;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}